

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O1

SchnorrKeyPairDataStruct *
cfd::js::api::json::SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey
          (SchnorrKeyPairDataStruct *__return_storage_ptr__,TweakPrivkeyDataStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  _Any_data local_140;
  undefined1 local_130 [16];
  undefined1 local_120 [40];
  _Alloc_hider local_f8;
  char local_e8 [16];
  int local_d8;
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->pubkey)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pubkey).field_2;
  (__return_storage_ptr__->pubkey)._M_string_length = 0;
  (__return_storage_ptr__->pubkey).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->parity = false;
  (__return_storage_ptr__->privkey)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->privkey).field_2;
  (__return_storage_ptr__->privkey)._M_string_length = 0;
  (__return_storage_ptr__->privkey).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = 0;
  local_158._8_8_ =
       std::
       _Function_handler<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:80:7)>
       ::_M_invoke;
  local_158._0_8_ =
       std::
       _Function_handler<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:80:7)>
       ::_M_manager;
  local_140._M_unused._M_object = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"TweakAddSchnorrPubkeyFromPrivkey","");
  ExecuteStructApi<cfd::js::api::TweakPrivkeyDataStruct,cfd::js::api::SchnorrKeyPairDataStruct>
            ((SchnorrKeyPairDataStruct *)local_120,(api *)request,
             (TweakPrivkeyDataStruct *)local_168,
             (function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
              *)&local_140,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_120);
  __return_storage_ptr__->parity = local_120[0x20];
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->privkey,(string *)&local_f8);
  (__return_storage_ptr__->error).code = local_d8;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (_Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_90._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_90._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_90);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  if (local_f8._M_p != local_e8) {
    operator_delete(local_f8._M_p);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_);
  }
  if ((undefined1 *)local_140._M_unused._0_8_ != local_130) {
    operator_delete(local_140._M_unused._M_object);
  }
  if ((code *)local_158._0_8_ != (code *)0x0) {
    (*(code *)local_158._0_8_)(local_168,local_168,3);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrKeyPairDataStruct SchnorrApi::TweakAddSchnorrPubkeyFromPrivkey(
    const TweakPrivkeyDataStruct& request) {
  auto call_func =
      [](const TweakPrivkeyDataStruct& request) -> SchnorrKeyPairDataStruct {
    SchnorrKeyPairDataStruct response;

    Privkey privkey(request.privkey);
    ByteData256 tweak(request.tweak);
    Privkey tweaked_privkey;
    bool parity = false;
    auto pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
        privkey, tweak, &tweaked_privkey, &parity);
    response.pubkey = pubkey.GetHex();
    response.privkey = tweaked_privkey.GetHex();
    response.parity = parity;
    return response;
  };

  SchnorrKeyPairDataStruct result;
  result = ExecuteStructApi<TweakPrivkeyDataStruct, SchnorrKeyPairDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}